

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::UniformCase::UniformCase
          (UniformCase *this,Context *context,char *name,char *description,
          CaseShaderType caseShaderType,
          SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
          *uniformCollection,deUint32 features)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000084;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,name,glcts::fixed_sample_locations_values + 1);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_02169480;
  iVar3 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_02169480;
  *(int *)&(this->super_CallLogWrapper).field_0x14 = (int)uniformCollection;
  (this->m_uniformCollection).m_ptr =
       *(UniformCollection **)CONCAT44(in_register_00000084,caseShaderType);
  pSVar2 = (SharedPtrStateBase *)((undefined8 *)CONCAT44(in_register_00000084,caseShaderType))[1];
  (this->m_uniformCollection).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_uniformCollection).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  this->m_caseShaderType = (CaseShaderType)description;
  (this->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_texturesCube).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_texturesCube).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_texturesCube).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UniformCase::UniformCase (Context& context, const char* const name, const char* const description, const CaseShaderType caseShaderType, const SharedPtr<const UniformCollection>& uniformCollection, const deUint32 features)
	: TestCase				(context, name, description)
	, CallLogWrapper		(context.getRenderContext().getFunctions(), m_testCtx.getLog())
	, m_features			(features)
	, m_uniformCollection	(uniformCollection)
	, m_caseShaderType		(caseShaderType)
{
}